

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

bool __thiscall
ON_OutlineFigure::IsInsideOf
          (ON_OutlineFigure *this,ON_OutlineFigure *outer_figure,bool bPerformExtraChecking)

{
  Orientation OVar1;
  bool bVar2;
  Orientation OVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  bool local_f1;
  Orientation this_orientation;
  uint local_d0;
  int wn;
  uint i;
  uint this_point_count;
  ON_2fPoint this_p [4];
  int outer_orientation_sign;
  double this_area;
  double outer_area;
  ON_BoundingBox outer_bbox;
  ON_BoundingBox this_bbox;
  Orientation outer_orientation;
  bool bPerformExtraChecking_local;
  ON_OutlineFigure *outer_figure_local;
  ON_OutlineFigure *this_local;
  
  if (outer_figure == (ON_OutlineFigure *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    OVar1 = FigureOrientation(outer_figure);
    if ((OVar1 == Clockwise) || (OVar1 == CounterClockwise)) {
      BoundingBox((ON_BoundingBox *)&outer_bbox.m_max.z,this);
      BoundingBox((ON_BoundingBox *)&outer_area,outer_figure);
      bVar2 = ON_BoundingBox::Includes
                        ((ON_BoundingBox *)&outer_area,(ON_BoundingBox *)&outer_bbox.m_max.z,false);
      if (bVar2) {
        dVar7 = AreaEstimate(outer_figure);
        dVar8 = AreaEstimate(this);
        local_f1 = 0.0 < ABS(dVar8) && ABS(dVar8) < ABS(dVar7);
        if (local_f1) {
          iVar4 = -1;
          if (OVar1 == CounterClockwise) {
            iVar4 = 1;
          }
          uVar5 = GetUpToFourPointsOnFigure(this,(ON_2fPoint *)&i);
          for (local_d0 = 0; local_d0 < uVar5; local_d0 = local_d0 + 1) {
            iVar6 = WindingNumber(outer_figure,*(ON_2fPoint *)(&i + (ulong)local_d0 * 2));
            if (iVar4 * iVar6 != 1) {
              return false;
            }
          }
          if (uVar5 == 0) {
            this_local._7_1_ = false;
          }
          else {
            OVar3 = FigureOrientation(this);
            if (((OVar1 != OVar3) && (!bPerformExtraChecking)) ||
               (bVar2 = Internal_ExtraInsideOfPolylineText(outer_figure,this), bVar2)) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OutlineFigure::IsInsideOf(
  const ON_OutlineFigure* outer_figure,
  bool bPerformExtraChecking
) const
{
  if (nullptr == outer_figure)
    return false;

  const ON_OutlineFigure::Orientation outer_orientation = outer_figure->FigureOrientation();
  if (ON_OutlineFigure::Orientation::Clockwise != outer_orientation && ON_OutlineFigure::Orientation::CounterClockwise != outer_orientation)
    return false;


  const ON_BoundingBox this_bbox = this->BoundingBox();
  const ON_BoundingBox outer_bbox = outer_figure->BoundingBox();
  if (false == outer_bbox.Includes(this_bbox))
  {
    // The bounding boxes are from the glyph outline control polygons.
    // There are rare case when this f is inside of other_f
    // but this_bbox is not contained in other_bbox. In practice, this
    // is quite rare, but that's why "probably" is part of this function's name.
    return false;
  }

  const double outer_area = fabs(outer_figure->AreaEstimate());
  const double this_area = fabs(this->AreaEstimate());
  if (false == (0.0 < this_area && this_area < outer_area))
    return false; // this figure is too big to be inside of other_f

  // Check that the 3 standard test points on this are inside of other_f.
  // Again, it is possible that the 3 test points are inside but some other
  // point is outside. In practice this is rare and that possibility
  // is why "probably" is in this function's name.

  const int outer_orientation_sign = ON_OutlineFigure::Orientation::CounterClockwise == outer_orientation ? 1 : -1;

  ON_2fPoint this_p[4];
  unsigned  this_point_count = this->GetUpToFourPointsOnFigure(this_p);

  for (unsigned i = 0; i < this_point_count; ++i)
  {
    // check start point.
    const int wn = outer_orientation_sign * outer_figure->WindingNumber(this_p[i]);
    if (1 != wn)
    {
      // this_p[i] is not inside of other_f.
      return false;
    }
  }

  if (0 == this_point_count)
    return false;

  const ON_OutlineFigure::Orientation this_orientation = this->FigureOrientation();

  if (outer_orientation == this_orientation || bPerformExtraChecking)
  {
    // The context that calls this function is sorting nested loops.
    // The orientation of outer_figure has been decided and set at this point.
    // When this orientation of this is not different, we need more checking
    // to verify that the orientation from the font definition file was really "wrong".
    // The "A crossbar" in Bahnschrift U+00C5 is one of many cases that
    // require this additional checking. More generally, glyphs with
    // orientations set correctly and which use overlapping outer 
    // boundaries need this test to prevent incorrectly. This situation is
    // common in fonts like Bahnschrift and fonts for Asian language scripts
    // that have "brush stroke" boundaries that overlap.
    if (false == Internal_ExtraInsideOfPolylineText(outer_figure, this))
      return false;
  }

  return true;
}